

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageFillToBorder(gdImagePtr im,int x,int y,int border,int color)

{
  int iVar1;
  bool bVar2;
  int x_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int x_01;
  int y_00;
  int x_02;
  
  if ((-1 < (color | border)) &&
     ((im->trueColor != 0 || (border < im->colorsTotal && color < im->colorsTotal)))) {
    iVar1 = im->alphaBlendingFlag;
    im->alphaBlendingFlag = 0;
    x_02 = 0;
    if (0 < x) {
      x_02 = x;
    }
    if (im->sx <= x) {
      x_02 = im->sx + -1;
    }
    y_00 = 0;
    if (0 < y) {
      y_00 = y;
    }
    if (im->sy <= y) {
      y_00 = im->sy + -1;
    }
    if (-1 < x_02) {
      iVar4 = gdImageGetPixel(im,x_02,y_00);
      iVar5 = x_02;
      x_01 = -1;
      while (x_00 = iVar5, iVar4 != border) {
        gdImageSetPixel(im,x_00,y_00,color);
        if (x_00 < 1) {
          x_01 = 0;
          goto LAB_0010e58b;
        }
        iVar4 = gdImageGetPixel(im,x_00 + -1,y_00);
        iVar5 = x_00 + -1;
        x_01 = x_00;
      }
      if (x_01 != -1) {
LAB_0010e58b:
        iVar5 = x_02 + 1;
        if (x_02 + 1 < im->sx) {
          do {
            iVar4 = iVar5;
            iVar5 = gdImageGetPixel(im,iVar4,y_00);
            if (iVar5 == border) break;
            gdImageSetPixel(im,iVar4,y_00,color);
            iVar5 = iVar4 + 1;
            x_02 = iVar4;
          } while (iVar4 + 1 < im->sx);
        }
        if ((0 < y_00) && (x_01 <= x_02)) {
          bVar2 = true;
          iVar5 = x_01;
          do {
            iVar4 = gdImageGetPixel(im,iVar5,y_00 + -1);
            bVar3 = iVar4 == color || iVar4 == border;
            if ((bVar2) && (bVar3 = true, iVar4 != color && iVar4 != border)) {
              gdImageFillToBorder(im,iVar5,y_00 + -1,border,color);
              bVar3 = false;
            }
            bVar2 = bVar3;
            iVar5 = iVar5 + 1;
          } while (x_02 + 1 != iVar5);
        }
        if ((y_00 < im->sy + -1) && (x_01 <= x_02)) {
          bVar2 = true;
          do {
            iVar5 = gdImageGetPixel(im,x_01,y_00 + 1);
            bVar3 = iVar5 == color || iVar5 == border;
            if ((bVar2) && (bVar3 = true, iVar5 != color && iVar5 != border)) {
              gdImageFillToBorder(im,x_01,y_00 + 1,border,color);
              bVar3 = false;
            }
            bVar2 = bVar3;
            x_01 = x_01 + 1;
          } while (x_02 + 1 != x_01);
        }
      }
    }
    im->alphaBlendingFlag = iVar1;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFillToBorder (gdImagePtr im, int x, int y, int border, int color)
{
	int lastBorder;
	/* Seek left */
	int leftLimit, rightLimit;
	int i;
	int restoreAlphaBleding;

	if (border < 0 || color < 0) {
		/* Refuse to fill to a non-solid border */
		return;
	}

	if (!im->trueColor) {
		if ((color > (im->colorsTotal - 1)) || (border > (im->colorsTotal - 1)) || (color < 0)) {
			return;
		}
	}

	leftLimit = (-1);

	restoreAlphaBleding = im->alphaBlendingFlag;
	im->alphaBlendingFlag = 0;

	if (x >= im->sx) {
		x = im->sx - 1;
	} else if (x < 0) {
		x = 0;
	}
	if (y >= im->sy) {
		y = im->sy - 1;
	} else if (y < 0) {
		y = 0;
	}
	
	for (i = x; (i >= 0); i--) {
		if (gdImageGetPixel (im, i, y) == border) {
			break;
		}
		gdImageSetPixel (im, i, y, color);
		leftLimit = i;
	}
	if (leftLimit == (-1)) {
		im->alphaBlendingFlag = restoreAlphaBleding;
		return;
	}
	/* Seek right */
	rightLimit = x;
	for (i = (x + 1); (i < im->sx); i++) {
		if (gdImageGetPixel (im, i, y) == border) {
			break;
		}
		gdImageSetPixel (im, i, y, color);
		rightLimit = i;
	}
	/* Look at lines above and below and start paints */
	/* Above */
	if (y > 0) {
		lastBorder = 1;
		for (i = leftLimit; (i <= rightLimit); i++) {
			int c;
			c = gdImageGetPixel (im, i, y - 1);
			if (lastBorder) {
				if ((c != border) && (c != color)) {
					gdImageFillToBorder (im, i, y - 1, border, color);
					lastBorder = 0;
				}
			} else if ((c == border) || (c == color)) {
				lastBorder = 1;
			}
		}
	}
	/* Below */
	if (y < ((im->sy) - 1)) {
		lastBorder = 1;
		for (i = leftLimit; (i <= rightLimit); i++) {
			int c = gdImageGetPixel (im, i, y + 1);
			if (lastBorder) {
				if ((c != border) && (c != color)) {
					gdImageFillToBorder (im, i, y + 1, border, color);
					lastBorder = 0;
				}
			} else if ((c == border) || (c == color)) {
				lastBorder = 1;
			}
		}
	}
	im->alphaBlendingFlag = restoreAlphaBleding;
}